

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,IndexAccessor *i_accessor,void *data)

{
  pointer pSVar1;
  undefined4 *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  ExpVarData exp_var_data;
  ExpVarData local_24 [3];
  
  *(undefined4 *)(in_RSI + 0x1c) = *in_RDX;
  ExpVarData::ExpVarData(local_24,SemanticOp_Read);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e5df9);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_24);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e5e1a);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_24);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(IndexAccessor *i_accessor, void *data)
    {
        // Set this IndexAccessor semantic from parent's semantic data
        i_accessor->semantic_ = static_cast<ExpVarData *>(data)->semantic_op_;

        // table_ and index_ expressions are read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        i_accessor->table_->Accept(this, &exp_var_data);
        i_accessor->index_->Accept(this, &exp_var_data);
    }